

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O1

void __thiscall TasgridWrapper::processEvalLike(TasgridWrapper *this)

{
  TypeCommand TVar1;
  byte bVar2;
  runtime_error *this_00;
  vector *__n;
  int *piVar3;
  void *__buf;
  int iVar4;
  long lVar5;
  Data2D<double> x;
  Data2D<double> result;
  internal_sparse_matrix matrix;
  Data2D<double> local_d0;
  long local_a8;
  pointer piStack_a0;
  vector<double,_std::allocator<double>_> local_98;
  undefined1 local_80 [8];
  pointer piStack_78;
  undefined1 local_70 [16];
  pointer pdStack_60;
  pointer local_58;
  pointer piStack_50;
  pointer local_48;
  pointer pdStack_40;
  pointer local_38;
  pointer local_30;
  pointer local_28;
  pointer pdStack_20;
  
  lVar5 = *(long *)&this->field_0x8;
  if (lVar5 == 0) {
    iVar4 = 0;
  }
  else {
    piVar3 = (int *)(lVar5 + 0x20);
    if (*(long *)(lVar5 + 0x28) == *(long *)(lVar5 + 0x30)) {
      piVar3 = (int *)(lVar5 + 0x48);
    }
    iVar4 = *piVar3;
  }
  if (this->pass_flag != true) {
    return;
  }
  verifiedRead(&local_d0,this,&this->xfilename,this->num_dimensions);
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8 = 0;
  piStack_a0 = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  TVar1 = this->command;
  switch(TVar1) {
  case command_getinterweights:
    piStack_78 = (pointer)(long)(int)(uint)local_d0.num_strips;
    local_80 = (undefined1  [8])(long)iVar4;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_70,(long)piStack_78 * (long)local_80
               ,(allocator_type *)&local_30);
    local_a8 = (long)local_80;
    piStack_a0 = piStack_78;
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_98,(vector<double,_std::allocator<double>_> *)local_70);
    if ((pointer)local_70._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_70._0_8_,(long)pdStack_60 - local_70._0_8_);
    }
    if (0 < (int)(uint)local_d0.num_strips) {
      lVar5 = 0;
      do {
        TasGrid::TasmanianSparseGrid::getInterpolationWeights
                  ((double *)this,
                   local_d0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + local_d0.stride * lVar5);
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)(uint)local_d0.num_strips);
    }
    break;
  case command_getdiffweights:
    local_80 = (undefined1  [8])((long)iVar4 * (long)this->num_dimensions);
    piStack_78 = (pointer)(long)(int)(uint)local_d0.num_strips;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_70,(long)local_80 * (long)piStack_78
               ,(allocator_type *)&local_30);
    local_a8 = (long)local_80;
    piStack_a0 = piStack_78;
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_98,(vector<double,_std::allocator<double>_> *)local_70);
    if ((pointer)local_70._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_70._0_8_,(long)pdStack_60 - local_70._0_8_);
    }
    if (0 < (int)(uint)local_d0.num_strips) {
      lVar5 = 0;
      do {
        TasGrid::TasmanianSparseGrid::getDifferentiationWeights
                  ((double *)this,
                   local_d0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + local_d0.stride * lVar5);
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)(uint)local_d0.num_strips);
    }
    break;
  case command_getpoints:
  case command_getneeded:
  case command_loadvalues:
  case command_integrate:
switchD_001306f6_caseD_d:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"ERROR: internal problem, processEvalLike() called with wrong command");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case command_evaluate:
    local_80 = (undefined1  [8])(long)this->num_outputs;
    piStack_78 = (pointer)(long)(int)(uint)local_d0.num_strips;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_70,(long)piStack_78 * (long)local_80
               ,(allocator_type *)&local_30);
    local_a8 = (long)local_80;
    piStack_a0 = piStack_78;
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_98,(vector<double,_std::allocator<double>_> *)local_70);
    if ((pointer)local_70._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_70._0_8_,(long)pdStack_60 - local_70._0_8_);
    }
    TasGrid::TasmanianSparseGrid::evaluateBatch
              ((double *)this,
               (int)local_d0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,(double *)(ulong)(uint)local_d0.num_strips);
    break;
  case command_differentiate:
    local_80 = (undefined1  [8])((long)this->num_dimensions * (long)this->num_outputs);
    piStack_78 = (pointer)(long)(int)(uint)local_d0.num_strips;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_70,(long)local_80 * (long)piStack_78
               ,(allocator_type *)&local_30);
    local_a8 = (long)local_80;
    piStack_a0 = piStack_78;
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_98,(vector<double,_std::allocator<double>_> *)local_70);
    if ((pointer)local_70._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_70._0_8_,(long)pdStack_60 - local_70._0_8_);
    }
    if (0 < (int)(uint)local_d0.num_strips) {
      lVar5 = 0;
      do {
        TasGrid::TasmanianSparseGrid::differentiate
                  ((double *)this,
                   local_d0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + local_d0.stride * lVar5);
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)(uint)local_d0.num_strips);
    }
    break;
  default:
    if (TVar1 == command_evalhierarchical_sparse) {
      local_80._0_4_ = iVar4;
      piStack_78 = (pointer)0x0;
      local_70._0_8_ = (pointer)0x0;
      local_70._8_8_ = (pointer)0x0;
      pdStack_60 = (pointer)0x0;
      local_58 = (pointer)0x0;
      piStack_50 = (pointer)0x0;
      local_48 = (pointer)0x0;
      pdStack_40 = (pointer)0x0;
      local_38 = (pointer)0x0;
      local_30 = local_d0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_28 = local_d0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      pdStack_20 = local_d0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      local_d0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __n = (vector *)&pdStack_60;
      TasGrid::TasmanianSparseGrid::evaluateSparseHierarchicalFunctions
                ((vector *)this,(vector *)&local_30,(vector *)&piStack_78,__n);
      if (local_30 != (pointer)0x0) {
        operator_delete(local_30,(long)pdStack_20 - (long)local_30);
      }
      internal_sparse_matrix::write
                ((internal_sparse_matrix *)local_80,(int)this + 0x180,(void *)(ulong)this->useASCII,
                 (size_t)__n);
      internal_sparse_matrix::write
                ((internal_sparse_matrix *)local_80,(uint)this->printCout,__buf,(size_t)__n);
      if (local_48 != (pointer)0x0) {
        operator_delete(local_48,(long)local_38 - (long)local_48);
      }
      if (pdStack_60 != (pointer)0x0) {
        operator_delete(pdStack_60,(long)piStack_50 - (long)pdStack_60);
      }
      if (piStack_78 != (pointer)0x0) {
        operator_delete(piStack_78,local_70._8_8_ - (long)piStack_78);
      }
      goto LAB_00130b2f;
    }
    if (TVar1 != command_evalhierarchical_dense) goto switchD_001306f6_caseD_d;
    if (*(long **)&this->field_0x8 == (long *)0x0) {
      bVar2 = 0;
    }
    else {
      bVar2 = (**(code **)(**(long **)&this->field_0x8 + 0x30))();
    }
    piStack_78 = (pointer)(long)(int)(uint)local_d0.num_strips;
    local_80 = (undefined1  [8])(long)(iVar4 << (bVar2 & 0x1f));
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_70,(long)piStack_78 * (long)local_80
               ,(allocator_type *)&local_30);
    local_a8 = (long)local_80;
    piStack_a0 = piStack_78;
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_98,(vector<double,_std::allocator<double>_> *)local_70);
    if ((pointer)local_70._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_70._0_8_,(long)pdStack_60 - local_70._0_8_);
    }
    TasGrid::TasmanianSparseGrid::evaluateHierarchicalFunctions
              ((double *)this,
               (int)local_d0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,(double *)(ulong)(uint)local_d0.num_strips);
  }
  writeMatrix(this,&this->outfilename,(int)piStack_a0,(int)local_a8,
              local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  printMatrix(this,(int)piStack_a0,(int)local_a8,
              local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start,false);
LAB_00130b2f:
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TasgridWrapper::processEvalLike() const{
    int num_points = grid.getNumPoints();
    if (not pass_flag) return;

    auto x = verifiedRead(xfilename, num_dimensions);

    Data2D<double> result;
    switch(command){
        case command_evaluate:
            result = Data2D<double>(num_outputs, x.getNumStrips());
            grid.evaluateBatch(x.data(), x.getNumStrips(), result.data());
            break;
        case command_differentiate:
            result = Data2D<double>(num_outputs * num_dimensions, x.getNumStrips());
            #pragma omp parallel for
            for (int i=0; i<x.getNumStrips(); i++)
                grid.differentiate(x.getStrip(i), result.getStrip(i));
            break;
        case command_getinterweights:
            result = Data2D<double>(num_points, x.getNumStrips());
            #pragma omp parallel for
            for(int i=0; i<x.getNumStrips(); i++)
                grid.getInterpolationWeights(x.getStrip(i), result.getStrip(i));
            break;
        case command_getdiffweights:
            result = Data2D<double>(num_points * num_dimensions, x.getNumStrips());
            #pragma omp parallel for
            for(int i=0; i<x.getNumStrips(); i++)
                grid.getDifferentiationWeights(x.getStrip(i), result.getStrip(i));
            break;
        case command_evalhierarchical_dense:
            result = Data2D<double>(num_points * (grid.isFourier() ? 2 : 1), x.getNumStrips());
            grid.evaluateHierarchicalFunctions(x.data(), x.getNumStrips(), result.data());
            break;
        case command_evalhierarchical_sparse:
        { // scope is needed to declare sparse variables
            internal_sparse_matrix matrix(num_points);
            grid.evaluateSparseHierarchicalFunctions(x.release(), matrix.pntr, matrix.indx, matrix.vals);
            matrix.write(outfilename, useASCII);
            matrix.write(printCout);
            return; // after this, there is output section but invalid for this command
        }
            break;
        default:
            throw std::runtime_error("ERROR: internal problem, processEvalLike() called with wrong command");
            break;
    }

    writeMatrix(outfilename, result);
    printMatrix(result);
}